

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O1

bool __thiscall yamc::fair::mutex::try_lock(mutex *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x40));
  if (iVar3 == 0) {
    lVar1 = *(long *)this;
    lVar2 = *(long *)(this + 8);
    if (lVar1 == lVar2) {
      *(long *)this = lVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x40));
    return lVar1 == lVar2;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool try_lock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (next_ != curr_)
      return false;
    ++next_;
    return true;
  }